

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventAgent.h
# Opt level: O3

ssize_t __thiscall
SyncEventAgent::send(SyncEventAgent *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int *piVar1;
  char cVar2;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  long *plVar3;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  pthread_mutex_lock((pthread_mutex_t *)&Mutex::mCriticalSection);
  piVar1 = &(this->super_EventAgent).super_Event.super_RefCount.mRefCount;
  *piVar1 = *piVar1 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&Mutex::mCriticalSection);
  cVar2 = (**(code **)(*plVar3 + 0x38))(plVar3);
  if (cVar2 == '\0') {
    (**(code **)*plVar3)(plVar3,this);
  }
  else {
    (*(this->super_EventAgent).super_Event.super_RefCount._vptr_RefCount[3])(this);
  }
  RefCount::Release((RefCount *)this);
  return extraout_RAX;
}

Assistant:

void send(IEventDispatcher *dispatcher)
	{
		// AddRef and Release calls are needed to provoke the
		// appropriate cleanup mechanisms for this SyncEventAgent
		// in the case that we do not send the event to the dispatcher.
		AddRef();
		
		if (dispatcher->isThreadCurrent())
		{
			deliver();
		}
		else
		{
			dispatcher->sendEventSync(this);
		}
		
		Release();
	}